

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-sp3.c
# Opt level: O0

void coda_sp3_done(void)

{
  long lVar1;
  int local_c;
  int i;
  
  lVar1 = __tls_get_addr(&PTR_00246d10);
  if (*(long *)(lVar1 + 0x1120) != 0) {
    for (local_c = 0; local_c < 0x4b; local_c = local_c + 1) {
      lVar1 = __tls_get_addr(&PTR_00246d10);
      if (*(long *)(*(long *)(lVar1 + 0x1120) + (long)local_c * 8) != 0) {
        lVar1 = __tls_get_addr(&PTR_00246d10);
        coda_type_release(*(coda_type **)(*(long *)(lVar1 + 0x1120) + (long)local_c * 8));
        lVar1 = __tls_get_addr(&PTR_00246d10);
        *(undefined8 *)(*(long *)(lVar1 + 0x1120) + (long)local_c * 8) = 0;
      }
    }
    lVar1 = __tls_get_addr(&PTR_00246d10);
    free(*(void **)(lVar1 + 0x1120));
    lVar1 = __tls_get_addr(&PTR_00246d10);
    *(undefined8 *)(lVar1 + 0x1120) = 0;
  }
  return;
}

Assistant:

void coda_sp3_done(void)
{
    int i;

    if (sp3_type == NULL)
    {
        return;
    }
    for (i = 0; i < num_sp3_types; i++)
    {
        if (sp3_type[i] != NULL)
        {
            coda_type_release(sp3_type[i]);
            sp3_type[i] = NULL;
        }
    }
    free(sp3_type);
    sp3_type = NULL;
}